

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O3

void __thiscall cfd::core::TapBranch::TapBranch(TapBranch *this,ByteData256 *commitment)

{
  this->_vptr_TapBranch = (_func_int **)&PTR__TapBranch_0072eaf8;
  this->has_leaf_ = false;
  this->leaf_version_ = '\0';
  Script::Script(&this->script_);
  ByteData256::ByteData256(&this->root_commitment_);
  (this->branch_list_).
  super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->branch_list_).
  super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->branch_list_).
  super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->root_commitment_,
             &commitment->data_);
  return;
}

Assistant:

TapBranch::TapBranch(const ByteData256& commitment)
    : has_leaf_(false), leaf_version_(0) {
  root_commitment_ = commitment;
}